

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O0

int kputuw(uint c,kstring_t *s)

{
  undefined1 uVar1;
  long lVar2;
  void *pvVar3;
  char *tmp;
  uint local_30;
  uint x;
  int i;
  int l;
  char buf [16];
  kstring_t *s_local;
  uint c_local;
  
  buf._8_8_ = s;
  if (c == 0) {
    s_local._4_4_ = kputc(0x30,s);
  }
  else {
    x = 0;
    for (tmp._4_4_ = c; tmp._4_4_ != 0; tmp._4_4_ = tmp._4_4_ / 10) {
      *(char *)((long)&i + (long)(int)x) = (char)((ulong)tmp._4_4_ % 10) + '0';
      x = x + 1;
    }
    local_30 = x;
    if (*(ulong *)(buf._8_8_ + 8) <= *(long *)buf._8_8_ + (long)(int)x + 1U) {
      *(long *)(buf._8_8_ + 8) = *(long *)buf._8_8_ + (long)(int)x + 2;
      *(long *)(buf._8_8_ + 8) = *(long *)(buf._8_8_ + 8) + -1;
      *(ulong *)(buf._8_8_ + 8) = *(ulong *)(buf._8_8_ + 8) >> 1 | *(ulong *)(buf._8_8_ + 8);
      *(ulong *)(buf._8_8_ + 8) = *(ulong *)(buf._8_8_ + 8) >> 2 | *(ulong *)(buf._8_8_ + 8);
      *(ulong *)(buf._8_8_ + 8) = *(ulong *)(buf._8_8_ + 8) >> 4 | *(ulong *)(buf._8_8_ + 8);
      *(ulong *)(buf._8_8_ + 8) = *(ulong *)(buf._8_8_ + 8) >> 8 | *(ulong *)(buf._8_8_ + 8);
      *(ulong *)(buf._8_8_ + 8) = *(ulong *)(buf._8_8_ + 8) >> 0x10 | *(ulong *)(buf._8_8_ + 8);
      *(long *)(buf._8_8_ + 8) = *(long *)(buf._8_8_ + 8) + 1;
      pvVar3 = realloc(*(void **)(buf._8_8_ + 0x10),*(size_t *)(buf._8_8_ + 8));
      if (pvVar3 == (void *)0x0) {
        return -1;
      }
      *(void **)(buf._8_8_ + 0x10) = pvVar3;
    }
    while (local_30 = local_30 - 1, -1 < (int)local_30) {
      uVar1 = *(undefined1 *)((long)&i + (long)(int)local_30);
      lVar2 = *(long *)buf._8_8_;
      *(long *)buf._8_8_ = lVar2 + 1;
      *(undefined1 *)(*(long *)(buf._8_8_ + 0x10) + lVar2) = uVar1;
    }
    *(undefined1 *)(*(long *)(buf._8_8_ + 0x10) + *(long *)buf._8_8_) = 0;
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static inline int kputuw(unsigned c, kstring_t *s)
{
	char buf[16];
	int l, i;
	unsigned x;
	if (c == 0) return kputc('0', s);
	for (l = 0, x = c; x > 0; x /= 10) buf[l++] = x%10 + '0';
	if (s->l + l + 1 >= s->m) {
		char *tmp;
		s->m = s->l + l + 2;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	for (i = l - 1; i >= 0; --i) s->s[s->l++] = buf[i];
	s->s[s->l] = 0;
	return 0;
}